

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# control.cpp
# Opt level: O2

bool Control::applyPressureControls(Network *network)

{
  double *pdVar1;
  double dVar2;
  pointer ppCVar3;
  Control *this;
  bool bVar4;
  pointer ppCVar5;
  bool bVar6;
  
  ppCVar5 = (network->controls).super__Vector_base<Control_*,_std::allocator<Control_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppCVar3 = (network->controls).super__Vector_base<Control_*,_std::allocator<Control_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  bVar6 = false;
  do {
    if (ppCVar5 == ppCVar3) {
      return bVar6;
    }
    this = *ppCVar5;
    if (*(int *)&(this->super_Element).field_0x2c == 1) {
      if (this->levelType == HI_LEVEL) {
        dVar2 = this->node->head;
        if (this->head <= dVar2 && dVar2 != this->head) goto LAB_0012bb88;
      }
      else if ((this->levelType == LOW_LEVEL) &&
              (pdVar1 = &this->node->head, *pdVar1 <= this->head && this->head != *pdVar1)) {
LAB_0012bb88:
        bVar4 = activate(this,true,(ostream *)&network->msgLog);
        bVar6 = (bool)(bVar6 | bVar4);
      }
    }
    ppCVar5 = ppCVar5 + 1;
  } while( true );
}

Assistant:

bool Control::applyPressureControls(Network* network)
{
    bool makeChange = true;
    bool changed = false;

    for (Control* control : network->controls)
    {
        if ( control->type == PRESSURE_LEVEL )
        {
            if ( (control->levelType == LOW_LEVEL &&
                  control->node->head < control->head)
            ||   (control->levelType == HI_LEVEL &&
                  control->node->head > control->head) )
            {
                if (control->activate(makeChange, network->msgLog))
                    changed = true;
            }
        }
    }

    return changed;
}